

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O0

bool __thiscall
UnconstrainedEquation::resolveOperandLeft(UnconstrainedEquation *this,OperandResolve *state)

{
  bool bVar1;
  int4 iVar2;
  OperandResolve *state_local;
  UnconstrainedEquation *this_local;
  
  state->cur_rightmost = -1;
  bVar1 = TokenPattern::getLeftEllipsis(&(this->super_PatternEquation).resultpattern);
  if ((!bVar1) &&
     (bVar1 = TokenPattern::getRightEllipsis(&(this->super_PatternEquation).resultpattern), !bVar1))
  {
    iVar2 = TokenPattern::getMinimumLength(&(this->super_PatternEquation).resultpattern);
    state->size = iVar2;
    return true;
  }
  state->size = -1;
  return true;
}

Assistant:

bool UnconstrainedEquation::resolveOperandLeft(OperandResolve &state) const

{
  state.cur_rightmost = -1;
  if (resultpattern.getLeftEllipsis()||resultpattern.getRightEllipsis()) // don't know length
    state.size = -1;
  else
    state.size = resultpattern.getMinimumLength();
  return true;
}